

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upsampling.c
# Opt level: O0

WebPUpsampleLinePairFunc WebPGetLinePairConverter(int alpha_is_last)

{
  int iVar1;
  int in_EDI;
  
  WebPInitUpsamplers();
  iVar1 = 4;
  if (in_EDI != 0) {
    iVar1 = 3;
  }
  return WebPUpsamplers[iVar1];
}

Assistant:

WebPUpsampleLinePairFunc WebPGetLinePairConverter(int alpha_is_last) {
  WebPInitUpsamplers();
#ifdef FANCY_UPSAMPLING
  return WebPUpsamplers[alpha_is_last ? MODE_BGRA : MODE_ARGB];
#else
  return (alpha_is_last ? DualLineSamplerBGRA : DualLineSamplerARGB);
#endif
}